

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_lua(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  int len;
  int ofs;
  int i;
  int arg_local;
  char *p_local;
  BuildCtx *ctx_local;
  
  if (ctx->mode == BUILD_libdef) {
    len = 0;
    while( true ) {
      if (libbc_map[len].name == (char *)0x0) {
        fprintf(_stderr,"Error: missing libbc definition for %s\n",p);
        exit(1);
      }
      iVar2 = strcmp(libbc_map[len].name,p);
      if (iVar2 == 0) break;
      len = len + 1;
    }
    iVar2 = libbc_map[len].ofs;
    iVar3 = libbc_map[len + 1].ofs - iVar2;
    obuf[2] = obuf[2] + '\x01';
    puVar1 = optr + 1;
    *optr = 0xf9;
    optr = puVar1;
    libdef_name(p,0);
    memcpy(optr,"" + iVar2,(long)iVar3);
    libdef_fixupbc(optr);
    optr = optr + iVar3;
  }
  return;
}

Assistant:

static void libdef_lua(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    int i;
    for (i = 0; libbc_map[i].name != NULL; i++) {
      if (!strcmp(libbc_map[i].name, p)) {
	int ofs = libbc_map[i].ofs;
	int len = libbc_map[i+1].ofs - ofs;
	obuf[2]++;  /* Bump hash table size. */
	*optr++ = LIBINIT_LUA;
	libdef_name(p, 0);
	memcpy(optr, libbc_code + ofs, len);
	libdef_fixupbc(optr);
	optr += len;
	return;
      }
    }
    fprintf(stderr, "Error: missing libbc definition for %s\n", p);
    exit(1);
  }
}